

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_queue.cpp
# Opt level: O1

uint32_t __thiscall
cppnet::BufferQueue::GetFreeMemoryBlock
          (BufferQueue *this,vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_> *block_vec,
          uint32_t size)

{
  pointer *ppIVar1;
  iterator iVar2;
  BufferBlock *pBVar3;
  element_type *peVar4;
  ulong uVar5;
  uint32_t uVar6;
  element_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  uint32_t mem_len_2;
  uint32_t mem_len_1;
  void *mem_2;
  void *mem_1;
  uint32_t local_68;
  uint32_t local_64;
  Iovec local_60;
  uint32_t local_4c;
  void *local_48;
  void *local_40;
  BufferQueue *local_38;
  
  local_40 = (void *)0x0;
  local_48 = (void *)0x0;
  local_64 = 0;
  local_68 = 0;
  local_4c = size;
  std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::reserve(block_vec,8);
  this_00 = (this->_buffer_write).
            super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->_buffer_write).
            super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  local_38 = this;
  if (local_4c == 0) {
    p_Var7 = this_01;
    if (this_00 == (BufferBlock *)0x0) {
      (*(this->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])(this);
      this_00 = (this->_buffer_list)._tail.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7 = (this->_buffer_list)._tail.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
    uVar6 = 0;
    while (this_01 = p_Var7, this_00 != (BufferBlock *)0x0) {
      BufferBlock::GetFreeMemoryBlock(this_00,&local_40,&local_64,&local_48,&local_68);
      uVar5 = (ulong)local_64;
      if (uVar5 != 0) {
        local_60._iov_base = local_40;
        iVar2._M_current =
             (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_60._iov_len = uVar5;
        if (iVar2._M_current ==
            (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::
          _M_realloc_insert<cppnet::Iovec>(block_vec,iVar2,&local_60);
        }
        else {
          (iVar2._M_current)->_iov_base = local_40;
          (iVar2._M_current)->_iov_len = uVar5;
          ppIVar1 = &(block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        uVar6 = uVar6 + local_64;
      }
      uVar5 = (ulong)local_68;
      if (uVar5 != 0) {
        local_60._iov_base = local_48;
        iVar2._M_current =
             (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_60._iov_len = uVar5;
        if (iVar2._M_current ==
            (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::
          _M_realloc_insert<cppnet::Iovec>(block_vec,iVar2,&local_60);
        }
        else {
          (iVar2._M_current)->_iov_base = local_48;
          (iVar2._M_current)->_iov_len = uVar5;
          ppIVar1 = &(block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        uVar6 = uVar6 + local_68;
      }
      pBVar3 = (local_38->_buffer_list)._tail.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7 = (local_38->_buffer_list)._tail.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      if (this_00 == pBVar3) break;
      peVar4 = (this_00->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var7 = (this_00->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        }
      }
      this_00 = peVar4;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
    }
  }
  else {
    uVar6 = 0;
    do {
      p_Var7 = this_01;
      if (this_00 == (BufferBlock *)0x0) {
        (*(local_38->super_InnerBuffer).super_Buffer._vptr_Buffer[0x13])();
        this_00 = (local_38->_buffer_list)._tail.
                  super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        p_Var7 = (local_38->_buffer_list)._tail.
                 super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi;
        if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
          }
        }
        if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
        }
      }
      BufferBlock::GetFreeMemoryBlock(this_00,&local_40,&local_64,&local_48,&local_68);
      uVar5 = (ulong)local_64;
      if (uVar5 != 0) {
        local_60._iov_base = local_40;
        iVar2._M_current =
             (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_60._iov_len = uVar5;
        if (iVar2._M_current ==
            (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::
          _M_realloc_insert<cppnet::Iovec>(block_vec,iVar2,&local_60);
        }
        else {
          (iVar2._M_current)->_iov_base = local_40;
          (iVar2._M_current)->_iov_len = uVar5;
          ppIVar1 = &(block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        uVar6 = uVar6 + local_64;
      }
      uVar5 = (ulong)local_68;
      if (uVar5 != 0) {
        local_60._iov_base = local_48;
        iVar2._M_current =
             (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        local_60._iov_len = uVar5;
        if (iVar2._M_current ==
            (block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>::
          _M_realloc_insert<cppnet::Iovec>(block_vec,iVar2,&local_60);
        }
        else {
          (iVar2._M_current)->_iov_base = local_48;
          (iVar2._M_current)->_iov_len = uVar5;
          ppIVar1 = &(block_vec->super__Vector_base<cppnet::Iovec,_std::allocator<cppnet::Iovec>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppIVar1 = *ppIVar1 + 1;
        }
        uVar6 = uVar6 + local_68;
      }
      pBVar3 = (this_00->super_ListSlot<cppnet::BufferBlock>)._next.
               super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      this_01 = (this_00->super_ListSlot<cppnet::BufferBlock>)._next.
                super___shared_ptr<cppnet::BufferBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      if (p_Var7 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
      }
      this_00 = pBVar3;
    } while (uVar6 < local_4c);
  }
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  return uVar6;
}

Assistant:

uint32_t BufferQueue::GetFreeMemoryBlock(std::vector<Iovec>& block_vec, uint32_t size) {
    void* mem_1 = nullptr;
    void* mem_2 = nullptr;
    uint32_t mem_len_1 = 0;
    uint32_t mem_len_2 = 0;

    block_vec.reserve(__block_vec_default_size);
    std::shared_ptr<BufferBlock> temp = _buffer_write;
    uint32_t cur_len = 0;
    if (size > 0) {
        while (cur_len < size) {
            if (temp == nullptr) {
                Append();
                temp = _buffer_list.GetTail();
            }
        
            temp->GetFreeMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
            if (mem_len_1 > 0) {
                block_vec.emplace_back(Iovec(mem_1, mem_len_1));
                cur_len += mem_len_1;
            }
            if (mem_len_2 > 0) {
                block_vec.emplace_back(Iovec(mem_2, mem_len_2));
                cur_len += mem_len_2;
            }
            temp = temp->GetNext();
        }

    } else {
        // add one block
        if (!temp) {
            Append();
            temp = _buffer_list.GetTail();
        }
        
        while (temp) {
            temp->GetFreeMemoryBlock(mem_1, mem_len_1, mem_2, mem_len_2);
            if (mem_len_1 > 0) {
                block_vec.emplace_back(Iovec(mem_1, mem_len_1));
                cur_len += mem_len_1;
            }
            if (mem_len_2 > 0) {
                block_vec.emplace_back(Iovec(mem_2, mem_len_2));
                cur_len += mem_len_2;
            }
            if (temp == _buffer_list.GetTail()) {
                break;
            }
            temp = temp->GetNext();
        }
    }
    return cur_len;
}